

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cc
# Opt level: O3

char lf::mesh::to_char(Orientation o)

{
  char cVar1;
  char cVar2;
  
  cVar2 = '-';
  if (o != negative) {
    cVar2 = '\0';
  }
  cVar1 = '+';
  if (o != positive) {
    cVar1 = cVar2;
  }
  return cVar1;
}

Assistant:

char to_char(Orientation o) {
  switch (o) {
    case lf::mesh::Orientation::positive: {
      return '+';
    }
    case lf::mesh::Orientation::negative: {
      return '-';
    }
  }
  return 0;
}